

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

int SampleFormatIsValid(PaSampleFormat format)

{
  ulong uVar1;
  PaSampleFormat format_local;
  undefined4 local_4;
  
  uVar1 = format & 0xffffffff7fffffff;
  if (uVar1 == 1) {
    local_4 = 1;
  }
  else if (uVar1 == 2) {
    local_4 = 1;
  }
  else if (uVar1 == 4) {
    local_4 = 1;
  }
  else if (uVar1 == 8) {
    local_4 = 1;
  }
  else if (uVar1 == 0x10) {
    local_4 = 1;
  }
  else if (uVar1 == 0x20) {
    local_4 = 1;
  }
  else if (uVar1 == 0x10000) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int SampleFormatIsValid( PaSampleFormat format )
{
    switch( format & ~paNonInterleaved )
    {
    case paFloat32: return 1;
    case paInt16: return 1;
    case paInt32: return 1;
    case paInt24: return 1;
    case paInt8: return 1;
    case paUInt8: return 1;
    case paCustomFormat: return 1;
    default: return 0;
    }
}